

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

void pythonInternalSubset(void *user_data,xmlChar *name,xmlChar *ExternalID,xmlChar *SystemID)

{
  int iVar1;
  PyObject *op;
  long lVar2;
  PyObject *result;
  PyObject *handler;
  xmlChar *SystemID_local;
  xmlChar *ExternalID_local;
  xmlChar *name_local;
  void *user_data_local;
  
  iVar1 = PyObject_HasAttrString(user_data,"internalSubset");
  if (iVar1 != 0) {
    op = (PyObject *)
         _PyObject_CallMethod_SizeT(user_data,"internalSubset","sss",name,ExternalID,SystemID);
    lVar2 = PyErr_Occurred();
    if (lVar2 != 0) {
      PyErr_Print();
    }
    _Py_XDECREF(op);
  }
  return;
}

Assistant:

static void
pythonInternalSubset(void *user_data, const xmlChar * name,
                     const xmlChar * ExternalID, const xmlChar * SystemID)
{
    PyObject *handler;
    PyObject *result;

#ifdef DEBUG_SAX
    printf("pythonInternalSubset(%s, %s, %s) called\n",
           name, ExternalID, SystemID);
#endif
    handler = (PyObject *) user_data;
    if (PyObject_HasAttrString(handler, (char *) "internalSubset")) {
        result = PyObject_CallMethod(handler, (char *) "internalSubset",
                                     (char *) "sss", name, ExternalID,
                                     SystemID);
        if (PyErr_Occurred())
            PyErr_Print();
        Py_XDECREF(result);
    }
}